

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::ValueExpressionBase::fromSymbol
          (ValueExpressionBase *this,ASTContext *context,Symbol *symbol,
          HierarchicalReference *hierRef,SourceRange sourceRange,bool constraintAllowed,
          bool isDottedAccess)

{
  __index_type _Var1;
  ushort uVar2;
  ConstantValue *pCVar3;
  Compilation *this_00;
  Scope *node;
  optional<slang::SourceRange> sourceRange_00;
  optional<slang::SourceRange> sourceRange_01;
  SourceRange sourceRange_02;
  bool bVar4;
  int iVar5;
  ConstantValue *pCVar6;
  Type *pTVar7;
  ArbitrarySymbolExpression *pAVar8;
  Diagnostic *pDVar9;
  Expression *pEVar10;
  uint uVar11;
  ASTContext *pAVar12;
  uint uVar13;
  DiagCode code;
  DiagCode code_00;
  SourceLocation SVar14;
  InstanceSymbolBase *inst;
  bool bVar15;
  string_view arg;
  SourceRange referencingRange;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange local_90;
  undefined4 local_7c;
  Symbol *local_78;
  Symbol *local_70;
  HierarchicalReference *local_68;
  SourceLocation SStack_60;
  undefined1 local_58;
  undefined7 uStack_57;
  HierarchicalReference *local_48;
  SourceLocation SStack_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  SVar14 = sourceRange.startLoc;
  local_7c = sourceRange.endLoc._0_4_;
  pCVar3 = (this->super_Expression).constant;
  this_00 = (Compilation *)**(undefined8 **)&this->super_Expression;
  iVar5 = *(int *)&(context->scope).ptr;
  uVar13 = (uint)pCVar3;
  local_90.startLoc = (SourceLocation)hierRef;
  local_90.endLoc = SVar14;
  local_78 = symbol;
  local_70 = symbol;
  bVar15 = false;
  switch(iVar5) {
  case 0x3b:
    iVar5 = *(int *)&context[6].scope.ptr[2].nameMap;
    if (iVar5 == 0xe) {
      if (((ulong)pCVar3 >> 0x2b & 1) == 0) goto LAB_003cef96;
      code_00.subsystem = Expressions;
      code_00.code = 0x58;
    }
    else {
      if ((iVar5 != 0xd) || ((int)uVar13 < 0)) goto LAB_003cef96;
      code_00.subsystem = Expressions;
      code_00.code = 0x5e;
    }
LAB_003cf1b1:
    sourceRange_05.endLoc = SVar14;
    sourceRange_05.startLoc = (SourceLocation)hierRef;
    pDVar9 = ASTContext::addDiag((ASTContext *)this,code_00,sourceRange_05);
    Diagnostic::operator<<(pDVar9,*(string_view *)&context->lookupIndex);
    goto LAB_003cf1cc;
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x46:
  case 0x47:
  case 0x53:
  case 0x54:
    uVar11 = *(uint *)&context[6].scope.ptr;
    if (uVar11 == 0) {
      if (iVar5 != 0x3f) {
        if (iVar5 == 0x54 && (uVar13 >> 0xe & 1) != 0) {
          code_00.subsystem = Expressions;
          code_00.code = 0x6b;
        }
        else {
          uVar2 = *(ushort *)((long)&context[6].scope.ptr + 4);
          if (((iVar5 == 0x47) || ((uVar2 & 0x20) != 0)) || (((ulong)pCVar3 & 0x2060) == 0)) {
            if ((uVar2 & 8) == 0 || ((ulong)pCVar3 >> 0x19 & 1) != 0) {
              if (((iVar5 != 0x3d || (char)((uVar2 & 0x20) >> 5) != '\0') ||
                   ((ulong)pCVar3 >> 0x2a & 1) == 0) || (context[6].lookupIndex != 3))
              goto LAB_003cef96;
              code_00.subsystem = Expressions;
              code_00.code = 0x91;
            }
            else {
              code_00.subsystem = Expressions;
              code_00.code = 0x47;
            }
          }
          else if (((ulong)pCVar3 & 0x20) == 0) {
            if (((ulong)pCVar3 & 0x40) == 0) {
              code_00.subsystem = Expressions;
              code_00.code = 0x19;
            }
            else {
              code_00.subsystem = Expressions;
              code_00.code = 0x1b;
            }
          }
          else {
            code_00.subsystem = Expressions;
            code_00.code = 0x1a;
          }
        }
        goto LAB_003cf1b1;
      }
      local_38 = 1;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_37;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc = SVar14;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)hierRef;
      local_48 = hierRef;
      SStack_40 = SVar14;
      bVar15 = Lookup::ensureAccessible((Symbol *)context,(ASTContext *)this,sourceRange_01);
      if (!bVar15) goto LAB_003cf1cc;
    }
    else if (iVar5 == 0x53) {
      if (((uVar13 >> 0x14 & 1) == 0) && (context[6].lookupIndex == 1)) {
        code_00.subsystem = Expressions;
        code_00.code = 0x40;
        goto LAB_003cf1b1;
      }
    }
    else {
      if (iVar5 == 0x4a) goto LAB_003cee8d;
      if (iVar5 == 0x48) goto switchD_003ced27_caseD_48;
    }
    goto LAB_003cef96;
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x49:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
    break;
  case 0x48:
switchD_003ced27_caseD_48:
    if ((context[2].flags.m_bits & 4) == 0) {
      local_58 = 1;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_57;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc = SVar14;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)hierRef;
      local_68 = hierRef;
      SStack_60 = SVar14;
      Lookup::ensureAccessible((Symbol *)context,(ASTContext *)this,sourceRange_00);
    }
LAB_003cef96:
    bVar15 = false;
    break;
  case 0x4a:
    uVar11 = (uint)*(byte *)&context[6].scope.ptr;
LAB_003cee8d:
    if ((uVar11 & 1) == 0) goto LAB_003cef96;
    code.subsystem = Expressions;
    code.code = 0x84;
    goto LAB_003cefd6;
  default:
    bVar15 = false;
    if (iVar5 == 0x27) {
      referencingRange.endLoc = SVar14;
      referencingRange.startLoc = (SourceLocation)hierRef;
      pCVar6 = ParameterSymbol::getValue((ParameterSymbol *)context,referencingRange);
      _Var1 = *(__index_type *)
               ((long)&(pCVar6->value).
                       super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               + 0x20);
      bVar15 = _Var1 == '\n';
      if ((uVar13 >> 9 & 1) == 0) {
        if (_Var1 == '\n') {
LAB_003cef17:
          if (((ulong)(this->super_Expression).constant & 2) == 0) {
            code.subsystem = Expressions;
            code.code = 0xa1;
            goto LAB_003cefd6;
          }
        }
      }
      else if (((byte)((ulong)pCVar3 >> 10) & _Var1 == '\n') != 0) goto LAB_003cef17;
      if (((ulong)pCVar3 >> 0x22 & 1) != 0) {
        sourceRange_03.endLoc = SVar14;
        sourceRange_03.startLoc = (SourceLocation)hierRef;
        ASTContext::addDiag((ASTContext *)this,(DiagCode)0xd50007,sourceRange_03);
      }
    }
  }
  bVar4 = Symbol::isValue((Symbol *)context);
  if (!bVar4) {
    iVar5 = *(int *)&(context->scope).ptr;
    if (((iVar5 == 0x48 & (byte)local_7c) != 0 ||
         ((byte)((ulong)pCVar3 >> 0x11) & 1 & iVar5 == 0x52) != 0) ||
       (((byte)((ulong)pCVar3 >> 0x18) >> 2 & 1 & iVar5 == 0x5b) == 1)) {
      pAVar8 = BumpAllocator::
               emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference_const*&,slang::SourceRange&>
                         ((BumpAllocator *)this_00,*(Scope **)&this->super_Expression,
                          (Symbol *)context,this_00->voidType,(HierarchicalReference **)&local_70,
                          &local_90);
      return &pAVar8->super_Expression;
    }
    if (*(size_t *)&context->lookupIndex == 0) {
      if ((iVar5 == 0x2f) || (pAVar12 = context, iVar5 == 0x57)) {
        arg = InstanceSymbolBase::getArrayName((InstanceSymbolBase *)context);
      }
      else {
        while ((iVar5 == 0x37 && (pAVar12[2].flags.m_bits != 0))) {
          pAVar12 = (ASTContext *)
                    (pAVar12->firstTempVar->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                    name._M_len;
          iVar5 = *(int *)&(pAVar12->scope).ptr;
        }
        arg = *(string_view *)&pAVar12->lookupIndex;
      }
      if (arg._M_len == 0) goto LAB_003cf1cc;
    }
    else {
      arg._M_str = (char *)(context->flags).m_bits;
      arg._M_len = *(size_t *)&context->lookupIndex;
    }
    sourceRange_02.endLoc = local_90.endLoc;
    sourceRange_02.startLoc = local_90.startLoc;
    pDVar9 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x25000a,sourceRange_02);
    pDVar9 = Diagnostic::operator<<(pDVar9,arg);
    Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(SourceLocation)context->instanceOrProc);
LAB_003cf1cc:
    pEVar10 = Expression::badExpr(this_00,(Expression *)0x0);
    return pEVar10;
  }
  if ((uVar13 >> 0x10 & 1) != 0) {
    pTVar7 = DeclaredType::getType((DeclaredType *)&context[1].lookupIndex);
    bVar4 = Type::isCHandle(pTVar7);
    if (bVar4) {
      code.subsystem = Expressions;
      code.code = 0x35;
      SVar14 = local_90.endLoc;
      hierRef = (HierarchicalReference *)local_90.startLoc;
LAB_003cefd6:
      sourceRange_04.endLoc = SVar14;
      sourceRange_04.startLoc = (SourceLocation)hierRef;
      ASTContext::addDiag((ASTContext *)this,code,sourceRange_04);
      goto LAB_003cf1cc;
    }
  }
  node = context[1].scope.ptr;
  if (((uint)((ulong)pCVar3 >> 0x27) & 1) != 0 || node == (Scope *)0x0) goto LAB_003cf0bc;
  if (constraintAllowed) {
    pTVar7 = DeclaredType::getType((DeclaredType *)&context[1].lookupIndex);
    bVar4 = Type::isClass(pTVar7);
    if ((!bVar4) && (bVar4 = Type::isCovergroup(pTVar7), !bVar4)) goto LAB_003cf086;
  }
  else {
LAB_003cf086:
    Compilation::noteReference(this_00,(SyntaxNode *)node,(bool)((byte)((ulong)pCVar3 >> 0x14) & 1))
    ;
    if ((~(ulong)pCVar3 & 0x4000100000) != 0) goto LAB_003cf0bc;
  }
  Compilation::noteReference(this_00,(SyntaxNode *)node,false);
LAB_003cf0bc:
  if ((local_78 == (Symbol *)0x0) || (*(long *)local_78 == 0)) {
    pAVar8 = (ArbitrarySymbolExpression *)
             BumpAllocator::
             emplace<slang::ast::NamedValueExpression,slang::ast::ValueSymbol_const&,slang::SourceRange&>
                       ((BumpAllocator *)this_00,(ValueSymbol *)context,&local_90);
  }
  else {
    pAVar8 = (ArbitrarySymbolExpression *)
             BumpAllocator::
             emplace<slang::ast::HierarchicalValueExpression,slang::ast::Scope_const&,slang::ast::ValueSymbol_const&,slang::ast::HierarchicalReference_const&,slang::SourceRange&>
                       ((BumpAllocator *)this_00,*(Scope **)&this->super_Expression,
                        (ValueSymbol *)context,(HierarchicalReference *)local_78,&local_90);
  }
  if (bVar15) {
    pTVar7 = Compilation::getUnboundedType(this_00);
    (pAVar8->super_Expression).type.ptr = pTVar7;
  }
  return &pAVar8->super_Expression;
}

Assistant:

Expression& ValueExpressionBase::fromSymbol(const ASTContext& context, const Symbol& symbol,
                                            const HierarchicalReference* hierRef,
                                            SourceRange sourceRange, bool constraintAllowed,
                                            bool isDottedAccess) {
    // Automatic variables have additional restrictions.
    bool isUnbounded = false;
    auto& comp = context.getCompilation();
    auto flags = context.flags;
    if (VariableSymbol::isKind(symbol.kind) &&
        symbol.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {

        // If this is actually a class property, check that no static methods,
        // initializers, or nested classes are accessing it.
        auto& var = symbol.as<VariableSymbol>();
        if (symbol.kind == SymbolKind::ClassProperty) {
            if (!Lookup::ensureAccessible(symbol, context, sourceRange))
                return badExpr(comp, nullptr);
        }
        else if (flags.has(ASTFlags::EventExpression) &&
                 symbol.kind == SymbolKind::LocalAssertionVar) {
            context.addDiag(diag::LocalVarEventExpr, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
        else if (!var.flags.has(VariableFlags::RefStatic) && flags.has(DisallowedAutoVarContexts) &&
                 var.kind != SymbolKind::PatternVar) {
            if (flags.has(ASTFlags::NonProcedural)) {
                context.addDiag(diag::AutoFromNonProcedural, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (flags.has(ASTFlags::StaticInitializer)) {
                context.addDiag(diag::AutoFromStaticInit, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (flags.has(ASTFlags::NonBlockingTimingControl)) {
                context.addDiag(diag::AutoFromNonBlockingTiming, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else {
                SLANG_UNREACHABLE;
            }
        }
        else if (!flags.has(ASTFlags::AllowCoverageSampleFormal) &&
                 var.flags.has(VariableFlags::CoverageSampleFormal)) {
            context.addDiag(diag::CoverageSampleFormal, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
        else if (flags.has(ASTFlags::ForkJoinAnyNone) && !var.flags.has(VariableFlags::RefStatic) &&
                 symbol.kind == SymbolKind::FormalArgument &&
                 symbol.as<FormalArgumentSymbol>().direction == ArgumentDirection::Ref) {
            // Can't refer to ref args in fork-join_any/none
            context.addDiag(diag::RefArgForkJoin, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
    }
    else if (symbol.kind == SymbolKind::ConstraintBlock) {
        if (!symbol.as<ConstraintBlockSymbol>().flags.has(ConstraintBlockFlags::Static))
            Lookup::ensureAccessible(symbol, context, sourceRange);
    }
    else if (symbol.kind == SymbolKind::Parameter) {
        // A note on the flags check: parameters with an unbounded value are allowed
        // anywhere that an unbounded literal is allowed, *except* for queue expressions,
        // which is indicated here by the AllowUnboundedLiteralArithmetic flag.
        isUnbounded = symbol.as<ParameterSymbol>().getValue(sourceRange).isUnbounded();
        if ((!flags.has(ASTFlags::AllowUnboundedLiteral) ||
             flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) &&
            isUnbounded && !context.inUnevaluatedBranch()) {
            context.addDiag(diag::UnboundedNotAllowed, sourceRange);
            return badExpr(comp, nullptr);
        }

        if (flags.has(ASTFlags::SpecifyBlock))
            context.addDiag(diag::SpecifyBlockParam, sourceRange);
    }
    else if (symbol.kind == SymbolKind::Net) {
        auto& netType = symbol.as<NetSymbol>().netType;
        if (netType.netKind == NetType::Interconnect && !flags.has(ASTFlags::AllowInterconnect)) {
            context.addDiag(diag::InterconnectReference, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }

        if (netType.netKind == NetType::UserDefined && flags.has(ASTFlags::DisallowUDNT)) {
            context.addDiag(diag::GateUDNTConn, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
    }
    else if (symbol.kind == SymbolKind::ClockVar && !flags.has(ASTFlags::LValue) &&
             symbol.as<ClockVarSymbol>().direction == ArgumentDirection::Out) {
        context.addDiag(diag::ClockVarOutputRead, sourceRange) << symbol.name;
        return badExpr(comp, nullptr);
    }
    else if (symbol.kind == SymbolKind::Specparam && symbol.as<SpecparamSymbol>().isPathPulse) {
        context.addDiag(diag::PathPulseInExpr, sourceRange);
        return badExpr(comp, nullptr);
    }

    if (!symbol.isValue()) {
        if ((symbol.kind == SymbolKind::ClockingBlock && flags.has(ASTFlags::AllowClockingBlock)) ||
            (symbol.kind == SymbolKind::ConstraintBlock && constraintAllowed) ||
            (symbol.kind == SymbolKind::Coverpoint && flags.has(ASTFlags::AllowCoverpoint))) {
            // Special case for event expressions and constraint block built-in methods.
            return *comp.emplace<ArbitrarySymbolExpression>(*context.scope, symbol,
                                                            comp.getVoidType(), hierRef,
                                                            sourceRange);
        }

        // It's possible for the name to be empty here in cases
        // where we looked up something like a generic class type
        // and there was some error in resolving it to a real type,
        // in which case `symbol` will be the ErrorType with an empty name.
        auto name = getNonValueName(symbol);
        if (!name.empty()) {
            auto& diag = context.addDiag(diag::NotAValue, sourceRange) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        return badExpr(comp, nullptr);
    }

    // chandles can't be referenced in sequence expressions
    auto& value = symbol.as<ValueSymbol>();
    if (flags.has(ASTFlags::AssertionExpr) && value.getType().isCHandle()) {
        context.addDiag(diag::CHandleInAssertion, sourceRange);
        return badExpr(comp, nullptr);
    }

    if (auto syntax = symbol.getSyntax(); syntax && !flags.has(ASTFlags::NoReference)) {
        bool isLValue = flags.has(ASTFlags::LValue);
        if (isDottedAccess) {
            auto& type = value.getType();
            if (type.isClass() || type.isCovergroup())
                isLValue = false;
        }

        comp.noteReference(*syntax, isLValue);

        if (isLValue && flags.has(ASTFlags::LAndRValue))
            comp.noteReference(*syntax, /* isLValue */ false);
    }

    Expression* result;
    if (hierRef && hierRef->target) {
        result = comp.emplace<HierarchicalValueExpression>(*context.scope, value, *hierRef,
                                                           sourceRange);
    }
    else {
        result = comp.emplace<NamedValueExpression>(value, sourceRange);
    }

    if (isUnbounded)
        result->type = &comp.getUnboundedType();
    return *result;
}